

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

int pybind11_traverse(PyObject *self,visitproc visit,void *arg)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)_PyObject_GetDictPtr();
  if (((PyObject *)*puVar2 != (PyObject *)0x0) &&
     (iVar1 = (*visit)((PyObject *)*puVar2,arg), iVar1 != 0)) {
    return iVar1;
  }
  if ((self->ob_type != (PyTypeObject *)0x0) &&
     (iVar1 = (*visit)((PyObject *)self->ob_type,arg), iVar1 != 0)) {
    return iVar1;
  }
  return 0;
}

Assistant:

inline int pybind11_traverse(PyObject *self, visitproc visit, void *arg) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject_VisitManagedDict(self, visit, arg);
#else
    PyObject *&dict = *_PyObject_GetDictPtr(self);
    Py_VISIT(dict);
#endif
// https://docs.python.org/3/c-api/typeobj.html#c.PyTypeObject.tp_traverse
#if PY_VERSION_HEX >= 0x03090000
    Py_VISIT(Py_TYPE(self));
#endif
    return 0;
}